

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GRouter.cpp
# Opt level: O0

int CGRouter::ConcurrentRouting
              (CDesign *pDesign,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iMode)

{
  size_type *psVar1;
  value_type pvVar2;
  CSegment *this;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_type sVar8;
  reference ppCVar9;
  size_type sVar10;
  reference ppCVar11;
  CLayer *pCVar12;
  int *piVar13;
  size_type sVar14;
  reference ppCVar15;
  pointer ppVar16;
  reference ppvVar17;
  CWire *pCVar18;
  FILE *__stream;
  char *pcVar19;
  CNet *this_00;
  double dVar20;
  pair<std::_Rb_tree_const_iterator<CBoundary_*>,_bool> pVar21;
  iterator iVar22;
  double local_758;
  CNet *pNet_1;
  CWire *pWire_2;
  CSegment *pSegment_1;
  int iIndex;
  char *pToken;
  FILE *pFile;
  char cLine [512];
  CSegment *pSegment;
  double dObjectValue;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvStack_410;
  int iSolMode;
  iterator local_408;
  iterator local_3f8;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *local_3e8;
  iterator local_3e0;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *local_3d0;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList_1;
  CBoundary *pCStack_3c0;
  int iNumSegmentList_1;
  CBoundary *pBoundary_1;
  iterator end;
  iterator itr;
  double dCost_1;
  double local_390;
  double dCost;
  undefined1 local_380;
  int local_378;
  int local_374;
  int iMaxY;
  int iMinY;
  int iX;
  int iZ_1;
  undefined1 local_360;
  int local_358;
  int local_354;
  int iMaxX;
  int iMinX;
  int iY;
  int iZ;
  CGrid *pGrid;
  CBoundary *pBoundary;
  CSegment *pCurSegment;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList;
  CNet *pCStack_320;
  int iNumSegmentList;
  CNet *pNet;
  CWire *pWire_1;
  undefined1 local_308 [8];
  set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> Boundary;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  Variable;
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  InverseVariable;
  CWire *pWire;
  int iNumWireRouted;
  int iNumVariable;
  int iD;
  int s;
  int y;
  int x;
  int k;
  int j;
  int i;
  char cName [512];
  undefined1 local_50 [8];
  CILPSolver ILPSolver;
  int iMode_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *pWireList_local;
  CDesign *pDesign_local;
  
  ILPSolver.m_pLPX._4_4_ = iMode;
  CILPSolver::CILPSolver((CILPSolver *)local_50);
  CILPSolver::Delete((CILPSolver *)local_50);
  CILPSolver::Create((CILPSolver *)local_50,&pDesign->field_0x234);
  pWire._4_4_ = 0;
  k = 0;
  sVar8 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  for (; k < (int)sVar8; k = k + 1) {
    ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
    if ((*ppCVar9 != (CWire *)0x0) && (iVar4 = FilterRouting(pDesign,*ppCVar9), iVar4 != 0)) {
      ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
      *ppCVar9 = (value_type)0x0;
      pWire._4_4_ = pWire._4_4_ + 1;
    }
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::vector((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
            *)&Variable._M_ht._M_num_elements);
  __gnu_cxx::
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  ::hash_map((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
              *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::set
            ((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> *)local_308);
  sVar8 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  iVar4 = CBBox::T(&pDesign->super_CBBox);
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::reserve((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
             *)&Variable._M_ht._M_num_elements,sVar8 * 2 * (long)iVar4);
  pWire_1 = (CWire *)0x0;
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::push_back((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
               *)&Variable._M_ht._M_num_elements,(value_type *)&pWire_1);
  k = 0;
  sVar8 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  for (; k < (int)sVar8; k = k + 1) {
    ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
    pNet = (CNet *)*ppCVar9;
    if (pNet != (CNet *)0x0) {
      iVar4 = CWire::IsRouted((CWire *)pNet);
      if (iVar4 != 0) {
        __assert_fail("!pWire->IsRouted()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x71c,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      pCStack_320 = CWire::GetParent((CWire *)pNet);
      if (pCStack_320 == (CNet *)0x0) {
        CWire::Delete((CWire *)pNet);
        ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
        *ppCVar9 = (value_type)0x0;
        pWire._4_4_ = pWire._4_4_ + 1;
      }
      else {
        if (pCStack_320 == (CNet *)0x0) {
          __assert_fail("pNet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x72a,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        iVar4 = CNet::IsRouted(pCStack_320);
        if (iVar4 != 0) {
          __assert_fail("!pNet->IsRouted()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x72b,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        iVar4 = CWire::IsPoint((CWire *)pNet);
        if (iVar4 != 0) {
          __assert_fail("!pWire->IsPoint()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x72c,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        CWire::Enumerate((CWire *)pNet,1);
        pSegmentList._4_4_ = CWire::GetNumSegmentList((CWire *)pNet);
        for (x = 0; x < pSegmentList._4_4_; x = x + 1) {
          pCurSegment = (CSegment *)CWire::GetSegmentList((CWire *)pNet,x);
          for (y = 0; sVar10 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size
                                         ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)
                                          pCurSegment), (ulong)(long)y < sVar10; y = y + 1) {
            ppCVar11 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::operator[]
                                 ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)pCurSegment,
                                  (long)y);
            pBoundary = (CBoundary *)*ppCVar11;
            pGrid = (CGrid *)0x0;
            _iY = 0;
            iVar4 = CSegment::IsHorizontal((CSegment *)pBoundary);
            if (iVar4 == 0) {
              iVar4 = CSegment::IsVertical((CSegment *)pBoundary);
              if (iVar4 == 0) {
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x76b,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iVar4 = CPoint::X(*(CPoint **)&pBoundary->m_iNumACap);
              iVar5 = CPoint::X(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (iVar4 != iVar5) {
                __assert_fail("pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x755,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iVar4 = CPoint::Z(*(CPoint **)&pBoundary->m_iNumACap);
              iVar5 = CPoint::Z(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (iVar4 != iVar5) {
                __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x756,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iMinY = CPoint::Z(*(CPoint **)&pBoundary->m_iNumACap);
              iMaxY = CPoint::X(*(CPoint **)&pBoundary->m_iNumACap);
              local_374 = CPoint::Y(*(CPoint **)&pBoundary->m_iNumACap);
              local_378 = CPoint::Y(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (local_378 < local_374) {
                __assert_fail("iMinY<=iMaxY",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x75c,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              for (iD = local_374; iD < local_378; iD = iD + 1) {
                pCVar12 = CDesign::GetLayer(pDesign,iMinY);
                pGrid = (CGrid *)CLayer::GetBoundary(pCVar12,iMaxY,iD);
                if (pGrid == (CGrid *)0x0) {
                  __assert_fail("pBoundary",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                ,0x761,
                                "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                               );
                }
                iVar4 = CBoundary::IsFound((CBoundary *)pGrid,pCStack_320);
                if (iVar4 == 0) {
                  CBoundary::AddSegmentList
                            (&pGrid->super_CBoundary,
                             (vector<CSegment_*,_std::allocator<CSegment_*>_> *)pCurSegment);
                  pVar21 = std::
                           set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::
                           insert((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>
                                   *)local_308,(value_type *)&pGrid);
                  dCost = (double)pVar21.first._M_node;
                  local_380 = pVar21.second;
                }
              }
            }
            else {
              iVar4 = CPoint::Y(*(CPoint **)&pBoundary->m_iNumACap);
              iVar5 = CPoint::Y(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (iVar4 != iVar5) {
                __assert_fail("pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x73d,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iVar4 = CPoint::Z(*(CPoint **)&pBoundary->m_iNumACap);
              iVar5 = CPoint::Z(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (iVar4 != iVar5) {
                __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x73e,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iMinX = CPoint::Z(*(CPoint **)&pBoundary->m_iNumACap);
              iMaxX = CPoint::Y(*(CPoint **)&pBoundary->m_iNumACap);
              local_354 = CPoint::X(*(CPoint **)&pBoundary->m_iNumACap);
              local_358 = CPoint::X(*(CPoint **)&(pBoundary->super_CPoint).m_iY);
              if (local_358 < local_354) {
                __assert_fail("iMinX<=iMaxX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x744,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              for (s = local_354; s < local_358; s = s + 1) {
                pCVar12 = CDesign::GetLayer(pDesign,iMinX);
                pGrid = (CGrid *)CLayer::GetBoundary(pCVar12,s,iMaxX);
                if (pGrid == (CGrid *)0x0) {
                  __assert_fail("pBoundary",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                ,0x749,
                                "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                               );
                }
                iVar4 = CBoundary::IsFound((CBoundary *)pGrid,pCStack_320);
                if (iVar4 == 0) {
                  CBoundary::AddSegmentList
                            (&pGrid->super_CBoundary,
                             (vector<CSegment_*,_std::allocator<CSegment_*>_> *)pCurSegment);
                  pVar21 = std::
                           set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::
                           insert((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>
                                   *)local_308,(value_type *)&pGrid);
                  _iX = pVar21.first._M_node;
                  local_360 = pVar21.second;
                }
              }
            }
          }
          if ((ILPSolver.m_pLPX._4_4_ & 0x1000) == 0) {
            if ((ILPSolver.m_pLPX._4_4_ & 0x2000) != 0) {
              iVar4 = CILPSolver::GetNumVariable((CILPSolver *)local_50);
              sprintf((char *)&j,"X%d",(ulong)(iVar4 + 1));
            }
          }
          else {
            j._0_1_ = 0;
          }
          if ((ILPSolver.m_pLPX._4_4_ & 8) == 0) {
            if ((ILPSolver.m_pLPX._4_4_ & 0x14) != 0) {
              iVar4 = CILPSolver::AddVariable((CILPSolver *)local_50,(char *)&j,0.0,1,0.0,1,1.0);
              itr._M_node = (_Base_ptr)pCurSegment;
              piVar13 = __gnu_cxx::
                        hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                        ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                      *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (key_type *)&itr);
              *piVar13 = iVar4;
            }
          }
          else {
            uVar6 = CParam::GetProp((CParam *)&(pDesign->super_CBBox).field_0x14);
            if ((uVar6 & 0x400) == 0) {
              local_758 = 0.0;
            }
            else {
              dVar20 = CWire::GetSegmentListCost
                                 ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)pCurSegment);
              local_758 = (1.0 / dVar20) / (double)(int)sVar8;
            }
            local_390 = local_758 + 1.0;
            iVar4 = CILPSolver::AddVariable((CILPSolver *)local_50,(char *)&j,local_390,1,0.0,1,1.0)
            ;
            dCost_1 = (double)pCurSegment;
            piVar13 = __gnu_cxx::
                      hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                      ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                    *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (key_type *)&dCost_1);
            *piVar13 = iVar4;
          }
          std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
          ::push_back((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       *)&Variable._M_ht._M_num_elements,(value_type *)&pCurSegment);
        }
        iVar4 = pSegmentList._4_4_ + 1;
        sVar14 = __gnu_cxx::
                 hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::size((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                         *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
        CILPSolver::PrepareCoeffBuffer((CILPSolver *)local_50,iVar4,(int)sVar14);
        if ((ILPSolver.m_pLPX._4_4_ & 0x1000) == 0) {
          if ((ILPSolver.m_pLPX._4_4_ & 0x2000) != 0) {
            iVar4 = CILPSolver::GetNumConstraint((CILPSolver *)local_50);
            sprintf((char *)&j,"Z%d",(ulong)(iVar4 + 1));
          }
        }
        else {
          j._0_1_ = 0;
        }
        if ((ILPSolver.m_pLPX._4_4_ & 8) == 0) {
          if ((ILPSolver.m_pLPX._4_4_ & 0x14) != 0) {
            CILPSolver::AddConstraint
                      ((CILPSolver *)local_50,(char *)&j,pSegmentList._4_4_,1,1.0,1,1.0);
          }
        }
        else {
          CILPSolver::AddConstraint
                    ((CILPSolver *)local_50,(char *)&j,pSegmentList._4_4_,1,0.0,1,1.0);
        }
      }
    }
  }
  psVar1 = &Variable._M_ht._M_num_elements;
  sVar8 = std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
          ::size((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                  *)psVar1);
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::resize((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
            *)psVar1,sVar8);
  sVar14 = __gnu_cxx::
           hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
           ::size((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                   *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar8 = std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
          ::size((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                  *)&Variable._M_ht._M_num_elements);
  if (sVar14 != sVar8 - 1) {
    __assert_fail("Variable.size()==InverseVariable.size()-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                  ,0x7b1,"static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                 );
  }
  sVar14 = __gnu_cxx::
           hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
           ::size((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                   *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((ILPSolver.m_pLPX._4_4_ & 8) == 0) {
    if (((ILPSolver.m_pLPX._4_4_ & 0x14) != 0) &&
       (iNumWireRouted =
             CILPSolver::AddVariable((CILPSolver *)local_50,"v-D",1.0,1,0.0,0,2139062143.0),
       (ILPSolver.m_pLPX._4_4_ & 0x10) != 0)) {
      CILPSolver::SetCoeffIndex((CILPSolver *)local_50,1,iNumWireRouted);
      iVar4 = CDesign::GetCapacity(pDesign,0x40);
      CILPSolver::AddConstraint((CILPSolver *)local_50,"c-D",1,1,0.0,1,(double)(iVar4 + 1));
    }
  }
  else {
    iNumWireRouted = -1;
  }
  end = std::set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::begin
                  ((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> *)
                   local_308);
  pBoundary_1 = (CBoundary *)
                std::set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::end
                          ((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> *
                           )local_308);
  while( true ) {
    bVar3 = std::operator!=(&end,(_Self *)&pBoundary_1);
    if (!bVar3) break;
    ppCVar15 = std::_Rb_tree_const_iterator<CBoundary_*>::operator*(&end);
    pCStack_3c0 = *ppCVar15;
    pSegmentList_1._4_4_ = CBoundary::GetNumSegmentList(pCStack_3c0);
    CILPSolver::PrepareCoeffBuffer((CILPSolver *)local_50,pSegmentList_1._4_4_ + 2,0);
    for (k = 0; k < pSegmentList_1._4_4_; k = k + 1) {
      local_3e8 = CBoundary::GetSegmentList(pCStack_3c0,k);
      local_3d0 = local_3e8;
      iVar22 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::find((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                       *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)&local_3e8);
      local_3e0 = iVar22;
      iVar22 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::end((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                      *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_3f8 = iVar22;
      bVar3 = __gnu_cxx::
              _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
              ::operator!=(&local_3e0,&local_3f8);
      if (!bVar3) {
        __assert_fail("Variable.find((ADDRESS)pSegmentList)!=Variable.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x7d4,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      pvStack_410 = local_3d0;
      iVar22 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::find((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                       *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)&stack0xfffffffffffffbf0);
      local_408 = iVar22;
      ppVar16 = __gnu_cxx::
                _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                ::operator->(&local_408);
      CILPSolver::SetCoeffIndex((CILPSolver *)local_50,k + 1,ppVar16->second);
      CILPSolver::SetCoeff((CILPSolver *)local_50,k + 1,2);
    }
    if ((ILPSolver.m_pLPX._4_4_ & 0x1000) == 0) {
      if ((ILPSolver.m_pLPX._4_4_ & 0x2000) != 0) {
        uVar6 = CILPSolver::GetNumConstraint((CILPSolver *)local_50);
        sprintf((char *)&j,"Y%d",(ulong)uVar6);
      }
    }
    else {
      j._0_1_ = 0;
    }
    iVar4 = pSegmentList_1._4_4_;
    if ((ILPSolver.m_pLPX._4_4_ & 8) == 0) {
      if ((ILPSolver.m_pLPX._4_4_ & 0x14) != 0) {
        if (iNumWireRouted < 1) {
          __assert_fail("iD>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x7ef,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        CILPSolver::SetCoeffIndex((CILPSolver *)local_50,k + 1,iNumWireRouted);
        pCVar12 = CBoundary::GetParent(pCStack_3c0);
        iVar4 = CLayer::GetCapacity(pCVar12,0x40);
        iVar5 = CDesign::GetCapacity(pDesign,0x40);
        CILPSolver::SetCoeff((CILPSolver *)local_50,k + 1,-(double)iVar4 / (double)iVar5);
        iVar4 = pSegmentList_1._4_4_ + 1;
        iVar5 = CBoundary::GetCapacity(pCStack_3c0,0x2000);
        CILPSolver::AddConstraint((CILPSolver *)local_50,(char *)&j,iVar4,0,0.0,1,(double)-iVar5);
        CILPSolver::SetCoeff((CILPSolver *)local_50,k + 1,1);
      }
    }
    else {
      if (iNumWireRouted != -1) {
        __assert_fail("iD==-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x7ea,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      iVar5 = CBoundary::GetCapacity(pCStack_3c0,0x1000);
      CILPSolver::AddConstraint((CILPSolver *)local_50,(char *)&j,iVar4,1,0.0,1,(double)iVar5);
    }
    CBoundary::ClearSegmentList(pCStack_3c0);
    iVar4 = CBoundary::GetNumSegmentList(pCStack_3c0);
    if (iVar4 != 0) {
      __assert_fail("pBoundary->GetNumSegmentList()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                    ,0x7fa,
                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
    }
    std::_Rb_tree_const_iterator<CBoundary_*>::operator++(&end);
  }
  uVar6 = CILPSolver::GetNumVariable((CILPSolver *)local_50);
  uVar7 = CILPSolver::GetNumConstraint((CILPSolver *)local_50);
  CObject::PrintMsg2("..#v=%d #c=%d ",(ulong)uVar6,(ulong)uVar7);
  dObjectValue._4_4_ = 0;
  if ((ILPSolver.m_pLPX._4_4_ & 0x1000) == 0) {
    if ((ILPSolver.m_pLPX._4_4_ & 0x2000) != 0) {
      sprintf((char *)&j,"%s_l%d.mps",&pDesign->field_0x234,(ulong)(pDesign->m_iLoop - 1));
      CILPSolver::Write((CILPSolver *)local_50,(char *)&j,1);
      sprintf((char *)&pFile,
              "mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0"
              ,&j);
      CreateAndWait((char *)&pFile);
      sprintf((char *)&j,"%s_l%d.sol",&pDesign->field_0x234,(ulong)(pDesign->m_iLoop - 1));
      __stream = fopen((char *)&j,"rt");
      while( true ) {
        pcVar19 = fgets((char *)&pFile,0x200,__stream);
        if (pcVar19 == (char *)0x0) break;
        strtok((char *)&pFile," \t\n");
        pcVar19 = strtok((char *)0x0," \t\n");
        if ((pcVar19 != (char *)0x0) && (*pcVar19 == 'X')) {
          iVar4 = atoi(pcVar19 + 1);
          strtok((char *)0x0," \t\n");
          pcVar19 = strtok((char *)0x0," \t\n");
          dVar20 = atof(pcVar19);
          if (0.5 <= dVar20) {
            ppvVar17 = std::
                       vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ::operator[]((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                     *)&Variable._M_ht._M_num_elements,(long)iVar4);
            ppCVar11 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::operator[](*ppvVar17,0)
            ;
            this = *ppCVar11;
            pCVar18 = CSegment::GetParent(this);
            if (pCVar18->m_pRoutedSegmentList !=
                (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
              __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList==NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                            ,0x873,
                            "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                           );
            }
            ppvVar17 = std::
                       vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ::operator[]((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                     *)&Variable._M_ht._M_num_elements,(long)iVar4);
            pvVar2 = *ppvVar17;
            pCVar18 = CSegment::GetParent(this);
            pCVar18->m_pRoutedSegmentList = pvVar2;
            pCVar18 = CSegment::GetParent(this);
            sVar8 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size
                              (pCVar18->m_pRoutedSegmentList);
            if (sVar8 == 0) {
              __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                            ,0x875,
                            "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                           );
            }
          }
        }
      }
    }
  }
  else {
    if ((ILPSolver.m_pLPX._4_4_ & 8) == 0) {
      if ((ILPSolver.m_pLPX._4_4_ & 4) == 0) {
        if ((ILPSolver.m_pLPX._4_4_ & 0x10) != 0) {
          if ((ILPSolver.m_pLPX._4_4_ & 0x20) == 0) {
            iVar4 = CILPSolver::GetNumConstraint((CILPSolver *)local_50);
            dObjectValue._4_4_ = 0x2100000;
            if (20000 < iVar4) {
              dObjectValue._4_4_ = 0;
            }
          }
          else {
            iVar4 = CILPSolver::GetNumConstraint((CILPSolver *)local_50);
            dObjectValue._4_4_ = 0x2010000;
            if (20000 < iVar4) {
              dObjectValue._4_4_ = 0;
            }
          }
        }
      }
      else if ((ILPSolver.m_pLPX._4_4_ & 0x20) == 0) {
        dObjectValue._4_4_ = 0x2100000;
      }
      else {
        dObjectValue._4_4_ = 0x2010000;
      }
    }
    else if ((ILPSolver.m_pLPX._4_4_ & 0x20) == 0) {
      dObjectValue._4_4_ = 0x1100000;
    }
    else {
      dObjectValue._4_4_ = 0x1010000;
    }
    if (dObjectValue._4_4_ == 0) {
      CObject::PrintMsg2("\t= discarded (maxc %d)\n",20000);
    }
    else {
      pSegment = (CSegment *)0x0;
      sVar8 = std::
              vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
              ::size((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                      *)&Variable._M_ht._M_num_elements);
      CILPSolver::PrepareSolutionBuffer((CILPSolver *)local_50,(int)sVar8);
      iVar4 = CILPSolver::Solve((CILPSolver *)local_50,dObjectValue._4_4_,(double *)&pSegment);
      if (iVar4 != 0) {
        CObject::PrintMsg2("*o=%.2f\t",pSegment);
        if ((ILPSolver.m_pLPX._4_4_ & 0x20) != 0) {
          CILPSolver::RoundUp((CILPSolver *)local_50,0.5);
        }
        if ((ILPSolver.m_pLPX._4_4_ & 0x10) != 0) {
          iVar4 = (int)(double)pSegment;
          iVar5 = CDesign::GetCapacity(pDesign,0x40);
          if (iVar5 < iVar4) {
            CObject::PrintMsg2("=give up solution\n");
            goto LAB_00113f30;
          }
        }
        for (k = 1; k <= (int)sVar14; k = k + 1) {
          dVar20 = CILPSolver::GetSolution((CILPSolver *)local_50,k);
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            psVar1 = &Variable._M_ht._M_num_elements;
            ppvVar17 = std::
                       vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ::operator[]((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                     *)psVar1,(long)k);
            ppCVar11 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::operator[](*ppvVar17,0)
            ;
            cLine._504_8_ = *ppCVar11;
            ppvVar17 = std::
                       vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ::operator[]((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                     *)psVar1,(long)k);
            pvVar2 = *ppvVar17;
            pCVar18 = CSegment::GetParent((CSegment *)cLine._504_8_);
            pCVar18->m_pRoutedSegmentList = pvVar2;
            pCVar18 = CSegment::GetParent((CSegment *)cLine._504_8_);
            sVar8 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size
                              (pCVar18->m_pRoutedSegmentList);
            if (sVar8 == 0) {
              __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                            ,0x83e,
                            "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                           );
            }
          }
        }
      }
    }
  }
LAB_00113f30:
  k = 0;
  sVar8 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  do {
    if ((int)sVar8 <= k) {
      std::set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>::~set
                ((set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> *)local_308
                );
      __gnu_cxx::
      hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::~hash_map((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                   *)&Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
      ::~vector((vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 *)&Variable._M_ht._M_num_elements);
      CILPSolver::~CILPSolver((CILPSolver *)local_50);
      return pWire._4_4_;
    }
    ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
    pCVar18 = *ppCVar9;
    if (pCVar18 != (CWire *)0x0) {
      this_00 = CWire::GetParent(pCVar18);
      if (this_00 == (CNet *)0x0) {
        CWire::Delete(pCVar18);
        ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
        *ppCVar9 = (value_type)0x0;
        pWire._4_4_ = pWire._4_4_ + 1;
      }
      else if (pCVar18->m_pRoutedSegmentList ==
               (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
        CWire::ClearSegmentList(pCVar18);
      }
      else {
        sVar10 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size
                           (pCVar18->m_pRoutedSegmentList);
        if (sVar10 == 0) {
          __assert_fail("pWire->m_pRoutedSegmentList->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x895,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        CWire::Pupate(pCVar18);
        CWire::Delete(pCVar18);
        ppCVar9 = std::vector<CWire_*,_std::allocator<CWire_*>_>::operator[](pWireList,(long)k);
        *ppCVar9 = (value_type)0x0;
        pWire._4_4_ = pWire._4_4_ + 1;
        CNet::Refine(this_00);
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int CGRouter::ConcurrentRouting(CDesign* pDesign, vector<CWire*>* pWireList, int iMode)
{
	// make ILP solver ready [6/22/2006 thyeros]
	CILPSolver ILPSolver;
	
	ILPSolver.Delete();
	ILPSolver.Create((char*)pDesign->m_Param.m_cInput_File);

	char cName[MAX_BUFFER_STR];

	int	i,j,k,x,y,s,iD,iNumVariable;
	int	iNumWireRouted		=	0;

	//////////////////////////////////////////////////////////////////////////
	// filtering the already routed wires [7/7/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;
		
		if(FilterRouting(pDesign,pWire))
		{	
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;			
		}
	}

	vector<vector<CSegment*>* >		InverseVariable;
	hash_map<ADDRESS, int>				Variable;
	set<CBoundary*>					Boundary;

	InverseVariable.reserve(pWireList->size()*2*pDesign->T());

	//thyeros: make the first empty as GLPK is doing [10/29/2005]
	InverseVariable.push_back((vector<CSegment*>*)NULL);
	
	//////////////////////////////////////////////////////////////////////////
	// variable constraints [6/24/2006 thyeros]
	// set objective function [6/24/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		assert(!pWire->IsRouted());

		CNet*	pNet	=	pWire->GetParent();
		// it is deleted from the net [7/1/2006 thyeros]
		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;			
			++iNumWireRouted;

			continue;
		}
		
		assert(pNet);
		assert(!pNet->IsRouted());
		assert(!pWire->IsPoint());

		pWire->Enumerate(ENUM_MODE_L);
		
		int	iNumSegmentList	=	pWire->GetNumSegmentList();
		
		for(j=0;j<iNumSegmentList;++j)
		{		
			vector<CSegment*>*	pSegmentList	=	pWire->GetSegmentList(j);
			for (k=0;k<pSegmentList->size();k++)
			{
				CSegment*	pCurSegment	=	(*pSegmentList)[k];
				CBoundary*	pBoundary	=	NULL;
				CGrid*		pGrid		=	NULL;
				
				if(pCurSegment->IsHorizontal())
				{
					assert(pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iY		=	pCurSegment->m_pPointS->Y();
					int	iMinX	=	pCurSegment->m_pPointS->X();
					int	iMaxX	=	pCurSegment->m_pPointE->X();
					
					assert(iMinX<=iMaxX);
					
					for (x=iMinX;x<iMaxX;x++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(x,iY);					
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						//Boundary[pBoundary->GetKey()]	=	pBoundary;

						Boundary.insert(pBoundary);
					}
				}
				else if(pCurSegment->IsVertical())
				{
					assert(pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iX		=	pCurSegment->m_pPointS->X();
					int	iMinY	=	pCurSegment->m_pPointS->Y();
					int	iMaxY	=	pCurSegment->m_pPointE->Y();
					
					assert(iMinY<=iMaxY);
					
					for (y=iMinY;y<iMaxY;y++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(iX,y);						
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						Boundary.insert(pBoundary);
					}
				}
				else
				{
					assert(FALSE);
				}
			}// for each segment [6/22/2006 thyeros]
				
			if(iMode&PROP_PARAM_SOLVER_GLPK)
			{
#ifdef _DEBUG
				sprintf(cName,"v-seg%d.(%d,%d,%d)-(%d,%d,%d).%d",
					(int)pNet->GetKey(),
					pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointS->Z(),
					pWire->m_pPointE->X(),pWire->m_pPointE->Y(),pWire->m_pPointE->Z(),j);
				for (k=0;k<pSegmentList->size();k++)
				{
					CSegment*	pCurSegment	=	(*pSegmentList)[k];
					sprintf(&cName[strlen(cName)],"=(%d,%d,%d)->(%d,%d,%d)",
						pCurSegment->m_pPointS->X(),pCurSegment->m_pPointS->Y(),pCurSegment->m_pPointS->Z(),
						pCurSegment->m_pPointE->X(),pCurSegment->m_pPointE->Y(),pCurSegment->m_pPointE->Z());
				}
#else
				cName[0]	=	NULL;		
#endif
			}
			else if(iMode&PROP_PARAM_SOLVER_MOSEK)
			{
				sprintf(cName,"X%d",ILPSolver.GetNumVariable()+1);
			}

			// each variable means a set of Segments which is a possible routing for this Wire [6/22/2006 thyeros]			
			// Variable[xxx] contains its index in problem matrix (column) [6/22/2006 thyeros]

			// layer assignment cost [9/22/2006 thyeros]
			if(iMode&PROP_PARAM_BOXR_ILPMAX)
			{
				double	dCost = 1+((pDesign->m_Param.GetProp()&PROP_PARAM_MULTILAYER)? 1.0/CWire::GetSegmentListCost(pSegmentList)/s:0);
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
			{
				double	dCost =	0;
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			
			InverseVariable.push_back(pSegmentList);
			
		}// for each segment list [6/22/2006 thyeros]
				
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+1,Variable.size());
		

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-wire%d.(%d,%d)-(%d,%d)",(int)pNet->GetKey(),pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointE->X(),pWire->m_pPointE->Y());
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Z%d",ILPSolver.GetNumConstraint()+1);
		}

		// add constraint such that one of segment lists for each wire should be selected [6/22/2006 thyeros]
		if(iMode&PROP_PARAM_BOXR_ILPMAX)								ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,1);
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))	ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,1,TRUE,1);	
	}// for each wire [6/22/2006 thyeros]
	
	InverseVariable.resize(InverseVariable.size());
	assert(Variable.size()==InverseVariable.size()-1);
	iNumVariable	=	Variable.size();

	//////////////////////////////////////////////////////////////////////////
	// depending on the obj, needs max utilization variable [6/28/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	if(iMode&PROP_PARAM_BOXR_ILPMAX)
	{
		iD	=	-1;
	}
	else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
	{
		iD	=	ILPSolver.AddVariable("v-D",1,TRUE,0,FALSE,MAX_NUMBER);

		if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			ILPSolver.SetCoeffIndex(1,iD);
			ILPSolver.AddConstraint("c-D",1,TRUE,0,TRUE,pDesign->GetCapacity(GET_MODE_MAX)+1);
		}
	}
	
	//////////////////////////////////////////////////////////////////////////
	// congestion constraint for each boundary [6/22/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(set<CBoundary*>::iterator itr=Boundary.begin(),end=Boundary.end();itr!=end;++itr)
	{
		CBoundary*	pBoundary	=	*itr;//->second;
		int	iNumSegmentList		=	pBoundary->GetNumSegmentList();
		
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+2);
		
		for (i=0;i<iNumSegmentList;++i)
		{
			vector<CSegment*>*	pSegmentList	=	pBoundary->GetSegmentList(i);
			
			assert(Variable.find((ADDRESS)pSegmentList)!=Variable.end());			
			ILPSolver.SetCoeffIndex(i+1,Variable.find((ADDRESS)pSegmentList)->second);

			// each segment needs its own required width and spacing [2/3/2007 thyeros]
			ILPSolver.SetCoeff(i+1,2);//pBoundary->GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING)+pSegmentList->at(0)->GetWidth());
		}

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-bnd(%d,%d,%d)_of_%d",pBoundary->X(),pBoundary->Y(),pBoundary->Z(),pBoundary->GetCapacity(GET_MODE_ACAP));
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Y%d",ILPSolver.GetNumConstraint());
		}

		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			assert(iD==-1);
			ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,pBoundary->GetCapacity(GET_MODE_ACAP));
		}
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
		{
			assert(iD>0);
			ILPSolver.SetCoeffIndex(i+1,iD);

			ILPSolver.SetCoeff(i+1,-1.0*pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)/pDesign->GetCapacity(GET_MODE_MAX));	
			ILPSolver.AddConstraint(cName,iNumSegmentList+1,FALSE,0,TRUE,-pBoundary->GetCapacity(GET_MODE_OCAP));

			// make it back to one for other variables [6/26/2006 thyeros]
			ILPSolver.SetCoeff(i+1,1);
		}
		
		pBoundary->ClearSegmentList();	
		assert(pBoundary->GetNumSegmentList()==0);
	}
	
	CObject::PrintMsg2("..#v=%d #c=%d ",ILPSolver.GetNumVariable(),ILPSolver.GetNumConstraint());
	
	int	iSolMode	=	0;
	if(iMode&PROP_PARAM_SOLVER_GLPK)
	{
		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPMIN)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			//////////////////////////////////////////////////////////////////////////
			// heuristically decide the better approach [6/29/2006 thyeros]
			// check # of constratins [6/29/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_MIP;
		}

		if(iSolMode)
		{
			//////////////////////////////////////////////////////////////////////////
			// solve the problem [6/24/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			double	dObjectValue	=	0;
			ILPSolver.PrepareSolutionBuffer(InverseVariable.size());			

#ifdef _DEBUG
			//sprintf(cName,"%s_p%d.txt",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
			//ILPSolver.Print(cName,SOL_PRINT_PRO);
#endif
	
			if(ILPSolver.Solve(iSolMode,&dObjectValue))
			{
#ifdef _DEBUG
				//sprintf(cName,"%s_s%d.txt",pDesign->GetName(),pDesign->m_iLoop-1);
				//ILPSolver.Print(cName,SOL_PRINT_SOL);
#endif
				CObject::PrintMsg2("*o=%.2f\t",dObjectValue);

				if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		ILPSolver.RoundUp(0.5);

				if(iMode&PROP_PARAM_BOXR_ILPHYD&&(int)dObjectValue>pDesign->GetCapacity(GET_MODE_MAX))
				{
					CObject::PrintMsg2("=give up solution\n");
				}
				else
				{
					//////////////////////////////////////////////////////////////////////////
					// retrieve the solution [6/24/2006 thyeros]
					//////////////////////////////////////////////////////////////////////////	
					for (i=1;i<=iNumVariable;++i)
					{
						if(ILPSolver.GetSolution(i))
						{	
							CSegment*	pSegment	=	(*InverseVariable[i])[0];

//							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[i];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}		
				}
#ifdef _DEBUG
				if(iD>0)
				{
					if((int)ILPSolver.GetSolution(iD)!=(int)dObjectValue)
					{
						printf("ERROR: ILP objective iD=%d(%f) vs dObjectValue=%d(%f)\n",
							(int)ILPSolver.GetSolution(iD),ILPSolver.GetSolution(iD),
							(int)dObjectValue,dObjectValue);
					}
					assert((int)ILPSolver.GetSolution(iD)==(int)dObjectValue);
				}
#endif
			}
		}
		else
		{
			CObject::PrintMsg2("\t= discarded (maxc %d)\n",MAX_ILP_CONSTRAINT);
		}
	}
	else if(iMode&PROP_PARAM_SOLVER_MOSEK)
	{
		sprintf(cName,"%s_l%d.mps",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		//sprintf(cName,"br.mps");
		ILPSolver.Write(cName,SOL_FORMAT_FREEMPS);

		// run mosek [10/13/2006 thyeros]
		char cLine[MAX_BUFFER_STR];

		sprintf(cLine,"mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0",cName);

		CreateAndWait(cLine);

		sprintf(cName,"%s_l%d.sol",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		for(FILE* pFile=fopen(cName,"rt");fgets(cLine,sizeof(cLine),pFile);)
		{
			char*	pToken	=	strtok(cLine," \t\n");
			pToken	=	strtok(NULL," \t\n");

			if(pToken==NULL)	continue;

			switch(pToken[0]){
				case 'X':
					{
						int		iIndex			=	atoi(pToken+1);
						strtok(NULL," \t\n");
						if(atof(strtok(NULL," \t\n"))>=0.5)
						{
							CSegment*	pSegment	=	(*InverseVariable[iIndex])[0];

							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[iIndex];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}
					break;
				default:
					break;
			}	
		}
	}

	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		CNet*	pNet	=	pWire->GetParent();

		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;

			// must be discarded [7/1/2006 thyeros]
			continue;
		}

		if(pWire->m_pRoutedSegmentList)
		{
			assert(pWire->m_pRoutedSegmentList->size());

/*			if(pNet->GetKey()==11)
			{
				pNet->Print(stdout,PRINT_MODE_TEXT);
				pWire->Print(stdout,PRINT_MODE_TEXT);

				printf("==============\n");				

				vector<CSegment*>* pSegmentList	=	pWire->m_pRoutedSegmentList;
				for(int k=0;k<pSegmentList->size();k++)
				{
					pSegmentList->at(k)->Print(stdout,PRINT_MODE_TEXT);	
				}
			}
*/

			pWire->Pupate();
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
	
			++iNumWireRouted;

			pNet->Refine();
		}
		else
		{
			pWire->ClearSegmentList();
		}

#ifdef _DEBUG
		if(pNet->GetKey()==pDesign->m_iDebugNet)
		{
			pDesign->PrintFile("debug.m",PRINT_MODE_MATLAB);
			pNet->PrintFile(">debug.m",PRINT_MODE_MATLAB);
		}
#endif
	}
	
	return	iNumWireRouted;
}